

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::walletdisplayaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff9d8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff9e0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  allocator_type *in_stack_fffffffffffffa10;
  allocator<char> *in_stack_fffffffffffffa18;
  iterator in_stack_fffffffffffffa20;
  RPCArgOptions *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  Fallback *in_stack_fffffffffffffa38;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffa40;
  undefined1 *puVar2;
  string *in_stack_fffffffffffffa48;
  RPCArg *in_stack_fffffffffffffa50;
  RPCResults *in_stack_fffffffffffffa58;
  RPCResult *in_stack_fffffffffffffa60;
  RPCExamples *in_stack_fffffffffffffb20;
  RPCResults *in_stack_fffffffffffffb28;
  RPCHelpMan *args;
  string *in_stack_fffffffffffffb38;
  _Alloc_hider in_stack_fffffffffffffb40;
  RPCHelpMan *in_stack_fffffffffffffb48;
  allocator<char> local_49a [2];
  pointer local_498;
  pointer pRStack_490;
  pointer local_488;
  allocator<char> local_472;
  allocator<char> local_471 [31];
  allocator<char> local_452;
  allocator<char> local_451 [32];
  allocator<char> local_431 [8];
  allocator<char> local_429 [31];
  allocator<char> local_40a;
  allocator<char> local_409 [73];
  RPCMethodImpl *in_stack_fffffffffffffc40;
  undefined1 local_388 [136];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_431[1] = (allocator<char>)0x0;
  local_431[2] = (allocator<char>)0x0;
  local_431[3] = (allocator<char>)0x0;
  local_431[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff9e8,(Optional *)in_stack_fffffffffffff9e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff9f0);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9d8);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                 (Type)((ulong)in_stack_fffffffffffffa40 >> 0x20),in_stack_fffffffffffffa38,
                 in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffa38 >> 0x38);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff9d8);
  __l._M_len = (size_type)in_stack_fffffffffffffa28;
  __l._M_array = in_stack_fffffffffffffa20;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffa18,__l,
             (allocator_type *)in_stack_fffffffffffffa10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_498 = (pointer)0x0;
  pRStack_490 = (pointer)0x0;
  local_488 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9d8);
  RPCResult::RPCResult
            (in_stack_fffffffffffffa60,(Type)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             &in_stack_fffffffffffffa50->m_names,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40
             ,(bool)skip_type_check);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff9d8);
  __l_00._M_len = (size_type)in_stack_fffffffffffffa28;
  __l_00._M_array = (iterator)in_stack_fffffffffffffa20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa18,__l_00,
             in_stack_fffffffffffffa10);
  RPCResult::RPCResult
            (in_stack_fffffffffffffa60,(Type)((ulong)in_stack_fffffffffffffa58 >> 0x20),
             &in_stack_fffffffffffffa50->m_names,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffffa58,(RPCResult *)in_stack_fffffffffffffa50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa28,(char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff9d8,(string *)0x4c99b3);
  this = (RPCArg *)&stack0xfffffffffffffb40;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::walletdisplayaddress()::__0,void>
            (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40._M_p,
             in_stack_fffffffffffffb38,(vector<RPCArg,_std::allocator<RPCArg>_> *)args,
             in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffc40);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_49a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9e8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_388;
  puVar1 = local_300;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff9e8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_472);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_471);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_452);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_451);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff9e8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_431);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_429);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_40a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_409);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletdisplayaddress()
{
    return RPCHelpMan{
        "walletdisplayaddress",
        "Display address on an external signer for verification.",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "bitcoin address to display"},
        },
        RPCResult{
            RPCResult::Type::OBJ,"","",
            {
                {RPCResult::Type::STR, "address", "The address as confirmed by the signer"},
            }
        },
        RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::shared_ptr<CWallet> const wallet = GetWalletForJSONRPCRequest(request);
            if (!wallet) return UniValue::VNULL;
            CWallet* const pwallet = wallet.get();

            LOCK(pwallet->cs_wallet);

            CTxDestination dest = DecodeDestination(request.params[0].get_str());

            // Make sure the destination is valid
            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid address");
            }

            util::Result<void> res = pwallet->DisplayAddress(dest);
            if (!res) throw JSONRPCError(RPC_MISC_ERROR, util::ErrorString(res).original);

            UniValue result(UniValue::VOBJ);
            result.pushKV("address", request.params[0].get_str());
            return result;
        }
    };
}